

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void arinvtrans(int p,double *old,double *new1)

{
  void *__ptr;
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  lVar6 = (long)p;
  __ptr = malloc(lVar6 * 8);
  uVar1 = 0;
  uVar5 = 0;
  if (0 < p) {
    uVar5 = (ulong)(uint)p;
  }
  for (; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    dVar7 = old[uVar1];
    new1[uVar1] = dVar7;
    *(double *)((long)__ptr + uVar1 * 8) = dVar7;
  }
  lVar2 = (lVar6 << 0x20) + -0x200000000;
  while (1 < lVar6) {
    lVar6 = lVar6 + -1;
    dVar7 = new1[lVar6];
    lVar3 = lVar2;
    for (lVar4 = 0; lVar4 < lVar6; lVar4 = lVar4 + 1) {
      *(double *)((long)__ptr + lVar4 * 8) =
           (*(double *)((long)new1 + (lVar3 >> 0x1d)) * dVar7 + new1[lVar4]) / (1.0 - dVar7 * dVar7)
      ;
      lVar3 = lVar3 + -0x100000000;
    }
    for (lVar3 = 0; lVar3 < lVar6; lVar3 = lVar3 + 1) {
      new1[lVar3] = *(double *)((long)__ptr + lVar3 * 8);
    }
    lVar2 = lVar2 + -0x100000000;
  }
  for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    dVar7 = atanh(new1[uVar1]);
    new1[uVar1] = dVar7;
  }
  free(__ptr);
  return;
}

Assistant:

void arinvtrans(int p, double *old, double *new1) {
	int j, k;
	double a;
	double *temp;

	temp = (double*)malloc(sizeof(double)* p);

	for (j = 0; j < p; ++j) {
		temp[j] = new1[j] = old[j];
	}

	for (j = p - 1; j > 0; --j) {
		a = new1[j];
		for (k = 0; k < j; ++k) {
			temp[k] = (new1[k] + a * new1[j - k - 1]) / (1 - a * a);
		}
		for (k = 0; k < j; ++k) {
			new1[k] = temp[k];
		}
	}

	for (j = 0; j < p; ++j) {
		new1[j] = atanh(new1[j]);
	}
	free(temp);
}